

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Options.cpp
# Opt level: O0

int __thiscall
ApprovalTests::Options::FileOptions::clone
          (FileOptions *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  int iVar1;
  FileOptions *this_00;
  string local_30 [32];
  __fn *local_10;
  FileOptions *local_8;
  
  this_00 = this;
  local_10 = __fn;
  local_8 = this;
  ::std::__cxx11::string::string(local_30,(string *)(__fn + 8));
  FileOptions(this_00,(string *)this);
  iVar1 = (int)this;
  ::std::__cxx11::string::~string(local_30);
  return iVar1;
}

Assistant:

Options::FileOptions Options::FileOptions::clone() const
    {
        // the returned options_ must be null
        return FileOptions(fileExtensionWithDot_);
    }